

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declared_entities.h
# Opt level: O2

void __thiscall Shogun::Shogun(Shogun *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Shogibear",&local_31);
  Entity::Entity(&this->super_Entity,&local_30,100);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_act_00117cf8;
  return;
}

Assistant:

Shogun() : Entity("Shogibear", 100) 
  {
    //nop
  }